

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O1

FT_Error PCF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Face pFVar1;
  FT_Stream stream;
  uchar *puVar2;
  uint uVar3;
  FT_Error FVar4;
  ushort *puVar5;
  uint *puVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  FT_Error FVar12;
  int iVar13;
  ulong uVar14;
  
  pFVar1 = size->face;
  if (pFVar1 == (FT_Face)0x0) {
    FVar4 = 0x23;
  }
  else {
    FVar4 = 6;
    if (glyph_index < (uint)pFVar1->num_glyphs) {
      stream = pFVar1->stream;
      lVar10 = pFVar1[2].num_glyphs;
      uVar14 = (ulong)glyph_index;
      iVar13 = (int)*(short *)(lVar10 + 6 + uVar14 * 0x18);
      uVar3 = *(short *)(lVar10 + 8 + uVar14 * 0x18) + iVar13;
      (slot->bitmap).rows = uVar3;
      iVar8 = (int)*(short *)(lVar10 + uVar14 * 0x18);
      lVar11 = (long)*(short *)(lVar10 + 2 + uVar14 * 0x18) - (long)iVar8;
      uVar9 = (uint)lVar11;
      (slot->bitmap).width = uVar9;
      (slot->bitmap).num_grays = 1;
      (slot->bitmap).pixel_mode = '\x01';
      bVar7 = *(byte *)&pFVar1[2].available_sizes & 3;
      FVar4 = 3;
      if ((1 << bVar7) - 1U < 8) {
        switch(bVar7) {
        case 0:
          uVar9 = uVar9 + 7 >> 3;
          break;
        case 1:
          uVar9 = uVar9 + 0xf >> 3 & 0xfffffffe;
          break;
        case 2:
          uVar9 = uVar9 + 0x1f >> 3 & 0xfffffffc;
          break;
        case 3:
          uVar9 = uVar9 + 0x3f >> 3 & 0xfffffff8;
        }
        lVar10 = lVar10 + uVar14 * 0x18;
        (slot->bitmap).pitch = uVar9;
        slot->format = FT_GLYPH_FORMAT_BITMAP;
        slot->bitmap_left = iVar8;
        slot->bitmap_top = iVar13;
        (slot->metrics).horiAdvance = (long)*(short *)(lVar10 + 4) << 6;
        (slot->metrics).horiBearingX = (long)iVar8 << 6;
        (slot->metrics).horiBearingY = (long)iVar13 << 6;
        (slot->metrics).width = lVar11 * 0x40;
        (slot->metrics).height = (ulong)(uVar3 * 0x40);
        ft_synthesize_vertical_metrics
                  (&slot->metrics,
                   (*(long *)&pFVar1[1].max_advance_width + *(long *)&pFVar1[1].units_per_EM) * 0x40
                  );
        FVar12 = 0;
        FVar4 = 0;
        if (((uint)load_flags >> 0x16 & 1) == 0) {
          uVar14 = (ulong)(slot->bitmap).rows * (long)(slot->bitmap).pitch;
          FVar4 = ft_glyphslot_alloc_bitmap(slot,uVar14);
          if (((FVar4 == 0) &&
              (FVar4 = FT_Stream_Seek(stream,*(FT_ULong *)(lVar10 + 0x10)), FVar4 == 0)) &&
             (FVar4 = FT_Stream_Read(stream,(slot->bitmap).buffer,uVar14), FVar4 == 0)) {
            if (uVar14 != 0 && ((ulong)pFVar1[2].available_sizes & 8) == 0) {
              puVar2 = (slot->bitmap).buffer;
              lVar10 = 0;
              do {
                bVar7 = puVar2[lVar10];
                bVar7 = bVar7 << 4 | bVar7 >> 4;
                bVar7 = bVar7 >> 2 & 0x33 | (bVar7 & 0x33) << 2;
                puVar2[lVar10] = bVar7 >> 1 & 0x55 | (bVar7 & 0x55) * '\x02';
                lVar10 = lVar10 + 1;
              } while (uVar14 - lVar10 != 0);
            }
            uVar3 = *(uint *)&pFVar1[2].available_sizes;
            FVar4 = 0;
            if (((uVar3 >> 3 ^ uVar3 >> 2) & 1) != 0) {
              iVar8 = 1 << ((byte)uVar3 >> 4 & 3);
              FVar4 = FVar12;
              if (iVar8 == 4) {
                if (3 < uVar14) {
                  puVar6 = (uint *)(slot->bitmap).buffer;
                  do {
                    uVar3 = *puVar6;
                    *puVar6 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                              uVar3 << 0x18;
                    uVar14 = uVar14 - 4;
                    puVar6 = puVar6 + 1;
                  } while (3 < uVar14);
                }
              }
              else if ((iVar8 == 2) && (1 < uVar14)) {
                puVar5 = (ushort *)(slot->bitmap).buffer;
                do {
                  *puVar5 = *puVar5 << 8 | *puVar5 >> 8;
                  uVar14 = uVar14 - 2;
                  puVar5 = puVar5 + 1;
                } while (1 < uVar14);
              }
            }
          }
        }
      }
    }
  }
  return FVar4;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    PCF_Face    face   = (PCF_Face)FT_SIZE_FACE( size );
    FT_Stream   stream;
    FT_Error    error  = FT_Err_Ok;
    FT_Bitmap*  bitmap = &slot->bitmap;
    PCF_Metric  metric;
    FT_ULong    bytes;


    FT_TRACE1(( "PCF_Glyph_Load: glyph index %d\n", glyph_index ));

    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    stream = face->root.stream;

    metric = face->metrics + glyph_index;

    bitmap->rows       = (unsigned int)( metric->ascent +
                                         metric->descent );
    bitmap->width      = (unsigned int)( metric->rightSideBearing -
                                         metric->leftSideBearing );
    bitmap->num_grays  = 1;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    switch ( PCF_GLYPH_PAD( face->bitmapsFormat ) )
    {
    case 1:
      bitmap->pitch = (int)( ( bitmap->width + 7 ) >> 3 );
      break;

    case 2:
      bitmap->pitch = (int)( ( ( bitmap->width + 15 ) >> 4 ) << 1 );
      break;

    case 4:
      bitmap->pitch = (int)( ( ( bitmap->width + 31 ) >> 5 ) << 2 );
      break;

    case 8:
      bitmap->pitch = (int)( ( ( bitmap->width + 63 ) >> 6 ) << 3 );
      break;

    default:
      return FT_THROW( Invalid_File_Format );
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = metric->leftSideBearing;
    slot->bitmap_top  = metric->ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( metric->characterWidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( metric->leftSideBearing * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( metric->ascent * 64 );
    slot->metrics.width        = (FT_Pos)( ( metric->rightSideBearing -
                                             metric->leftSideBearing ) * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    ( face->accel.fontAscent +
                                      face->accel.fontDescent ) * 64 );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* XXX: to do: are there cases that need repadding the bitmap? */
    bytes = (FT_ULong)bitmap->pitch * bitmap->rows;

    error = ft_glyphslot_alloc_bitmap( slot, (FT_ULong)bytes );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( metric->bits )          ||
         FT_STREAM_READ( bitmap->buffer, bytes ) )
      goto Exit;

    if ( PCF_BIT_ORDER( face->bitmapsFormat ) != MSBFirst )
      BitOrderInvert( bitmap->buffer, bytes );

    if ( ( PCF_BYTE_ORDER( face->bitmapsFormat ) !=
           PCF_BIT_ORDER( face->bitmapsFormat )  ) )
    {
      switch ( PCF_SCAN_UNIT( face->bitmapsFormat ) )
      {
      case 1:
        break;

      case 2:
        TwoByteSwap( bitmap->buffer, bytes );
        break;

      case 4:
        FourByteSwap( bitmap->buffer, bytes );
        break;
      }
    }

  Exit:
    return error;
  }